

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promise.h
# Opt level: O1

void __thiscall Promise::Promise(Promise *this,ManuallyResolvedHandler *in_handler)

{
  undefined8 uVar1;
  int iVar2;
  
  (this->super_enable_shared_from_this<Promise>)._M_weak_this.
  super___weak_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<Promise>)._M_weak_this.
  super___weak_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_Promise = (_func_int **)&PTR_Tick_00108c68;
  *(undefined8 *)&(this->manually_resolved_handler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->manually_resolved_handler).super__Function_base._M_functor + 8) = 0;
  (this->manually_resolved_handler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->manually_resolved_handler)._M_invoker = in_handler->_M_invoker;
  if ((in_handler->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(in_handler->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->manually_resolved_handler).super__Function_base._M_functor =
         *(undefined8 *)&(in_handler->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->manually_resolved_handler).super__Function_base._M_functor + 8) =
         uVar1;
    (this->manually_resolved_handler).super__Function_base._M_manager =
         (in_handler->super__Function_base)._M_manager;
    (in_handler->super__Function_base)._M_manager = (_Manager_type)0x0;
    in_handler->_M_invoker = (_Invoker_type)0x0;
  }
  (this->auto_resolved_handler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->auto_resolved_handler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->auto_resolved_handler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->auto_resolved_handler).super__Function_base._M_functor + 8) = 0;
  this->handler_ran = false;
  *(undefined8 *)&this->state = 0;
  *(undefined8 *)((long)&this->data + 4) = 0;
  *(undefined8 *)((long)&this->passed_value + 4) = 0;
  *(undefined8 *)
   ((long)&(this->parent).super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = 0;
  *(undefined8 *)
   ((long)&(this->parent).super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
   + 4) = 0;
  *(undefined8 *)
   ((long)&(this->children).
           super__Vector_base<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->children).
           super__Vector_base<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->children).
           super__Vector_base<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  this->is_registered = false;
  printf("ManuallyResolvedHandler ");
  iVar2 = _init()::id_counter + 1;
  this->id = _init()::id_counter;
  _init()::id_counter = iVar2;
  return;
}

Assistant:

explicit Promise(ManuallyResolvedHandler in_handler): manually_resolved_handler(std::move(in_handler)) {
    printf("ManuallyResolvedHandler ");
    _init();
  }